

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O3

enable_if_t<(std::is_integral<int>::value_&&_std::is_signed<int>::value),_uintwide_t<256U,_unsigned_short,_void,_true>_>
* __thiscall
math::wide_integer::uintwide_t<256u,unsigned_short,void,true>::operator>>=
          (uintwide_t<256u,unsigned_short,void,true> *this,int n)

{
  undefined1 auVar1 [16];
  
  if (n < 0) {
    if ((uint)-n < 0x100) {
      uintwide_t<256U,_unsigned_short,_void,_true>::shl<unsigned_int>
                ((uintwide_t<256U,_unsigned_short,_void,_true> *)this,-n);
    }
    else {
      *(undefined1 (*) [16])(this + 0x10) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])this = (undefined1  [16])0x0;
    }
  }
  else if (n != 0) {
    if ((uint)n < 0x100) {
      uintwide_t<256U,_unsigned_short,_void,_true>::shr<int>
                ((uintwide_t<256U,_unsigned_short,_void,_true> *)this,n);
    }
    else {
      auVar1 = pshuflw(ZEXT216(*(ushort *)(this + 0x1e)),ZEXT216(*(ushort *)(this + 0x1e)),0);
      auVar1._4_4_ = auVar1._0_4_;
      auVar1._8_4_ = auVar1._0_4_;
      auVar1._12_4_ = auVar1._0_4_;
      auVar1 = psraw(auVar1,0xf);
      *(undefined1 (*) [16])this = auVar1;
      *(undefined1 (*) [16])(this + 0x10) = auVar1;
    }
  }
  return (enable_if_t<(std::is_integral<int>::value_&&_std::is_signed<int>::value),_uintwide_t<256U,_unsigned_short,_void,_true>_>
          *)this;
}

Assistant:

constexpr auto operator>>=(const SignedIntegralType n) -> std::enable_if_t<(   std::is_integral<SignedIntegralType>::value
                                                                                && std::is_signed  <SignedIntegralType>::value), uintwide_t>&
    {
      // Implement right-shift operator for signed integral argument.
      if(n < static_cast<SignedIntegralType>(0))
      {
        using local_unsigned_type =
          typename detail::uint_type_helper<static_cast<size_t>(std::numeric_limits<SignedIntegralType>::digits + 1)>::exact_unsigned_type;

        operator<<=(static_cast<local_unsigned_type>(detail::negate(n)));
      }
      else if(n > static_cast<SignedIntegralType>(0))
      {
        if(exceeds_width(n))
        {
          // Fill with either 0's or 1's. Note also the implementation-defined
          // behavior of excessive right-shift of negative value.

          // Exclude this line from code coverage, even though explicit
          // test cases (search for "result_overshift_is_ok") are known
          // to cover this line.
          detail::fill_unsafe(values.begin(), values.end(), right_shift_fill_value()); // LCOV_EXCL_LINE
        }
        else
        {
          shr(n);
        }
      }

      return *this;
    }